

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

void __thiscall testing::internal::DeathTestImpl::~DeathTestImpl(DeathTestImpl *this)

{
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  int local_10;
  allocator local_9;
  
  (this->super_DeathTest)._vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_001518a8;
  if (this->read_fd_ == -1) {
    return;
  }
  std::__cxx11::string::string((string *)&local_50,"CHECK failed: File ",&local_9);
  std::operator+(&local_70,&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/lib/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_90,&local_70,", line ");
  local_10 = 0x181;
  StreamableToString<int>(&local_30,&local_10);
  std::operator+(&local_b0,&local_90,&local_30);
  std::operator+(&local_d0,&local_b0,": ");
  std::operator+(&local_f0,&local_d0,"read_fd_ == -1");
  DeathTestAbort(&local_f0);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

~DeathTestImpl() { GTEST_DEATH_TEST_CHECK_(read_fd_ == -1); }